

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lex.hpp
# Opt level: O3

void __thiscall
cfgfile::lexical_analyzer_t<cfgfile::qstring_trait_t>::skip_spaces
          (lexical_analyzer_t<cfgfile::qstring_trait_t> *this)

{
  input_stream_t<cfgfile::qstring_trait_t> *piVar1;
  char cVar2;
  char_t ch;
  
  piVar1 = this->m_stream;
  if ((((piVar1->m_returned_char).c.super__Deque_base<QChar,_std::allocator<QChar>_>._M_impl.
        super__Deque_impl_data._M_finish._M_cur ==
        (piVar1->m_returned_char).c.super__Deque_base<QChar,_std::allocator<QChar>_>._M_impl.
        super__Deque_impl_data._M_start._M_cur) && (cVar2 = QTextStream::atEnd(), cVar2 != '\0')) &&
     (piVar1->m_buf_pos == (piVar1->m_buf).d.size)) {
    return;
  }
  ch = input_stream_t<cfgfile::qstring_trait_t>::get(this->m_stream);
  while( true ) {
    if (((const_t<cfgfile::qstring_trait_t>::c_space != ch.ucs) &&
        (const_t<cfgfile::qstring_trait_t>::c_tab != ch.ucs)) &&
       ((const_t<cfgfile::qstring_trait_t>::c_carriage_return != ch.ucs &&
        (const_t<cfgfile::qstring_trait_t>::c_line_feed != ch.ucs)))) {
      input_stream_t<cfgfile::qstring_trait_t>::put_back(this->m_stream,ch);
      return;
    }
    piVar1 = this->m_stream;
    if ((((piVar1->m_returned_char).c.super__Deque_base<QChar,_std::allocator<QChar>_>._M_impl.
          super__Deque_impl_data._M_finish._M_cur ==
          (piVar1->m_returned_char).c.super__Deque_base<QChar,_std::allocator<QChar>_>._M_impl.
          super__Deque_impl_data._M_start._M_cur) && (cVar2 = QTextStream::atEnd(), cVar2 != '\0'))
       && (piVar1->m_buf_pos == (piVar1->m_buf).d.size)) break;
    ch = input_stream_t<cfgfile::qstring_trait_t>::get(this->m_stream);
  }
  return;
}

Assistant:

void skip_spaces()
	{
		if( m_stream.at_end() )
			return;

		typename Trait::char_t ch = m_stream.get();

		while( is_space_char( ch ) )
		{
			if( m_stream.at_end() )
				return;

			ch = m_stream.get();
		}

		m_stream.put_back( ch );
	}